

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeYield(ExpressionContext *ctx,SynYield *syntax)

{
  bool bVar1;
  int iVar2;
  ExprBase *pEVar3;
  undefined4 extraout_var;
  TypeBase *pTVar4;
  FunctionData *pFVar5;
  TypeFunction *pTVar6;
  undefined4 extraout_var_00;
  ExprBase *pEVar8;
  SynBase *pSVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TypeBase *pTVar10;
  char *msg;
  uint state;
  ExpressionContext *this;
  ExprBase *pEVar7;
  
  if (syntax->value == (SynBase *)0x0) {
    this = (ExpressionContext *)ctx->allocator;
    iVar2 = (*(*(_func_int ***)this)[2])(this,0x30);
    pEVar3 = (ExprBase *)CONCAT44(extraout_var,iVar2);
    pTVar4 = ctx->typeVoid;
    pEVar3->typeID = 2;
    pEVar3->source = &syntax->super_SynBase;
    pEVar3->type = pTVar4;
    pEVar3->next = (ExprBase *)0x0;
    pEVar3->listed = false;
    pEVar3->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3b40;
  }
  else {
    this = ctx;
    pEVar3 = AnalyzeExpression(ctx,syntax->value);
    pTVar4 = pEVar3->type;
  }
  if ((pTVar4 != (TypeBase *)0x0) && (pTVar4->typeID == 0)) {
    pFVar5 = ExpressionContext::GetCurrentFunction(this,ctx->scope);
    if (pFVar5 != (FunctionData *)0x0) {
      pFVar5->hasExplicitReturn = true;
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    pEVar7 = (ExprBase *)CONCAT44(extraout_var_01,iVar2);
    pTVar4 = pEVar3->type;
    pEVar7->typeID = 0x1d;
    pEVar7->source = &syntax->super_SynBase;
    pEVar7->type = pTVar4;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3b78;
    pEVar7[1]._vptr_ExprBase = (_func_int **)pEVar3;
    *(undefined8 *)&pEVar7[1].typeID = 0;
    pEVar7[1].source = (SynBase *)0x0;
    *(undefined4 *)&pEVar7[1].type = 0;
    return pEVar7;
  }
  pFVar5 = ExpressionContext::GetCurrentFunction(this,ctx->scope);
  if (pFVar5 == (FunctionData *)0x0) {
    msg = "ERROR: global yield is not allowed";
  }
  else {
    if (pFVar5->coroutine != false) {
      pTVar4 = pFVar5->type->returnType;
      if (pTVar4 == ctx->typeAuto) {
        bVar1 = AssertValueExpression(ctx,&syntax->super_SynBase,pEVar3);
        if (!bVar1) {
          iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
          pEVar7 = (ExprBase *)CONCAT44(extraout_var_02,iVar2);
          pTVar4 = ctx->typeVoid;
          iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
          pSVar9 = pEVar3->source;
          pTVar10 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
          ExprError::ExprError
                    ((ExprError *)CONCAT44(extraout_var_03,iVar2),pSVar9,pTVar10,pEVar3,
                     (ExprBase *)0x0);
          pEVar7->typeID = 0x1c;
          pEVar7->source = &syntax->super_SynBase;
          pEVar7->type = pTVar4;
          pEVar7->next = (ExprBase *)0x0;
          pEVar7->listed = false;
          pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3670;
          pEVar7[1]._vptr_ExprBase = (_func_int **)CONCAT44(extraout_var_03,iVar2);
          *(undefined8 *)&pEVar7[1].typeID = 0;
          pEVar7[1].source = (SynBase *)0x0;
          return pEVar7;
        }
        pTVar4 = pEVar3->type;
        pTVar6 = ExpressionContext::GetFunctionType
                           (ctx,&syntax->super_SynBase,pTVar4,pFVar5->type->arguments);
        pFVar5->type = pTVar6;
      }
      pTVar10 = ctx->typeVoid;
      if ((pTVar4 == ctx->typeVoid) && (pTVar10 = pTVar4, pEVar3->type != pTVar4)) {
        anon_unknown.dwarf_ff84f::Report
                  (ctx,&syntax->super_SynBase,"ERROR: \'void\' function returning a value");
        pTVar10 = ctx->typeVoid;
      }
      if ((pTVar4 != pTVar10) && (pEVar3->type == pTVar10)) {
        anon_unknown.dwarf_ff84f::Report
                  (ctx,&syntax->super_SynBase,"ERROR: function must return a value of type \'%.*s\'"
                   ,(ulong)(uint)(*(int *)&(pTVar4->name).end - (int)(pTVar4->name).begin));
      }
      pEVar3 = CreateCast(ctx,&syntax->super_SynBase,pEVar3,pFVar5->type->returnType,false);
      pFVar5->hasExplicitReturn = true;
      state = pFVar5->yieldCount + 1;
      pFVar5->yieldCount = state;
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pEVar7 = (ExprBase *)CONCAT44(extraout_var_00,iVar2);
      pTVar4 = ctx->typeVoid;
      pEVar8 = CreateFunctionCoroutineStateUpdate(ctx,&syntax->super_SynBase,pFVar5,state);
      pSVar9 = (SynBase *)CreateArgumentUpvalueClose(ctx,&syntax->super_SynBase,pFVar5);
      pEVar7->typeID = 0x1d;
      pEVar7->source = &syntax->super_SynBase;
      pEVar7->type = pTVar4;
      pEVar7->next = (ExprBase *)0x0;
      pEVar7->listed = false;
      pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3b78;
      pEVar7[1]._vptr_ExprBase = (_func_int **)pEVar3;
      *(ExprBase **)&pEVar7[1].typeID = pEVar8;
      pEVar7[1].source = pSVar9;
      *(uint *)&pEVar7[1].type = state;
      return pEVar7;
    }
    msg = "ERROR: yield can only be used inside a coroutine";
  }
  anon_unknown.dwarf_ff84f::Stop(ctx,&syntax->super_SynBase,msg);
}

Assistant:

ExprBase* AnalyzeYield(ExpressionContext &ctx, SynYield *syntax)
{
	ExprBase *result = syntax->value ? AnalyzeExpression(ctx, syntax->value) : new (ctx.get<ExprVoid>()) ExprVoid(syntax, ctx.typeVoid);

	if(isType<TypeError>(result->type))
	{
		if(FunctionData *function = ctx.GetCurrentFunction(ctx.scope))
			function->hasExplicitReturn = true;

		return new (ctx.get<ExprYield>()) ExprYield(syntax, result->type, result, NULL, NULL, 0);
	}

	if(FunctionData *function = ctx.GetCurrentFunction(ctx.scope))
	{
		if(!function->coroutine)
			Stop(ctx, syntax, "ERROR: yield can only be used inside a coroutine");

		TypeBase *returnType = function->type->returnType;

		// If return type is auto, set it to type that is being returned
		if(returnType == ctx.typeAuto)
		{
			if(!AssertValueExpression(ctx, syntax, result))
				return new (ctx.get<ExprReturn>()) ExprReturn(syntax, ctx.typeVoid, new (ctx.get<ExprError>()) ExprError(result->source, ctx.GetErrorType(), result, NULL), NULL, NULL);

			returnType = result->type;

			function->type = ctx.GetFunctionType(syntax, returnType, function->type->arguments);
		}

		if(returnType == ctx.typeVoid && result->type != ctx.typeVoid)
			Report(ctx, syntax, "ERROR: 'void' function returning a value");
		if(returnType != ctx.typeVoid && result->type == ctx.typeVoid)
			Report(ctx, syntax, "ERROR: function must return a value of type '%.*s'", FMT_ISTR(returnType->name));

		result = CreateCast(ctx, syntax, result, function->type->returnType, false);

		function->hasExplicitReturn = true;

		// TODO: checked return value

		unsigned yieldId = ++function->yieldCount;

		return new (ctx.get<ExprYield>()) ExprYield(syntax, ctx.typeVoid, result, CreateFunctionCoroutineStateUpdate(ctx, syntax, function, yieldId), CreateArgumentUpvalueClose(ctx, syntax, function), yieldId);
	}

	Stop(ctx, syntax, "ERROR: global yield is not allowed");

	return NULL;
}